

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O3

tuple<std::vector<int,_std::allocator<int>_>_> *
testinator::Arbitrary<std::tuple<std::vector<int,_std::allocator<int>_>_>_>::generate_n
          (tuple<std::vector<int,_std::allocator<int>_>_> *__return_storage_ptr__,size_t n,
          unsigned_long randomSeed)

{
  TestRegistry *pTVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  pointer piVar5;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  pTVar1 = TestRegistry::Instance();
  uVar3 = randomSeed & 0xffffffff;
  (pTVar1->m_generator)._M_x[0] = uVar3;
  lVar2 = 0x19;
  do {
    uVar3 = (ulong)((((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2) - 0x18);
    *(ulong *)(&(pTVar1->m_tests)._M_t._M_impl.field_0x0 + lVar2 * 8) = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x288);
  (pTVar1->m_generator)._M_p = 0x270;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0xffffffffffffffff;
  ::std::uniform_int_distribution<unsigned_long>::operator()
            ((uniform_int_distribution<unsigned_long> *)&local_48,&pTVar1->m_generator,
             (param_type *)&local_48);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = 0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  piVar5 = (pointer)0x0;
  if (n != 0) {
    sVar4 = 0;
    do {
      local_4c = detail::Arbitrary_Arithmetic<int>::generate(n,randomSeed + sVar4);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_48,
                   (iterator)
                   local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_4c);
      }
      else {
        *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_4c;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      sVar4 = sVar4 + 1;
    } while (n != sVar4);
    piVar5 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>).
    super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>)
           .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
   4) = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>).
    super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>)
           .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   4) = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>).
  super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       piVar5;
  return __return_storage_ptr__;
}

Assistant:

static std::tuple<Ts...> generate_n(std::size_t n, unsigned long int randomSeed)
    {
      auto r1 = randomSeed;
      auto r2 = nextRandom(r1);

      using H = std::tuple_element_t<0, std::tuple<Ts...>>;
      using T = decltype(tuple_tail(std::declval<std::tuple<Ts...>>()));
      return tuple_cons(Arbitrary<H>::generate_n(n, r1),
                        Arbitrary<T>::generate_n(n, r2));
    }